

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TElasticity2DAnalytic::Sigma
          (TElasticity2DAnalytic *this,TPZVec<double> *x,TPZFMatrix<double> *sigma)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  long *in_RDX;
  long in_RDI;
  double dVar4;
  double dVar5;
  STATE Fac_1;
  STATE Fac;
  REAL nu;
  REAL E;
  TPZFNMatrix<4,_double> grad;
  double *in_stack_fffffffffffffd80;
  double *in_stack_fffffffffffffd88;
  TPZFNMatrix<4,_double> *in_stack_fffffffffffffd90;
  int64_t in_stack_fffffffffffffd98;
  TPZFMatrix<double> *in_stack_fffffffffffffda0;
  TPZFMatrix<double> *this_00;
  TPZFMatrix<double> *in_stack_ffffffffffffff00;
  double dVar6;
  TPZVec<double> *in_stack_ffffffffffffff08;
  TElasticity2DAnalytic *in_stack_ffffffffffffff10;
  undefined8 local_e0;
  undefined8 local_d8;
  
  TPZFNMatrix<4,_double>::TPZFNMatrix(in_stack_fffffffffffffd90);
  (**(code **)(*in_RDX + 0x68))(in_RDX,2);
  Elastic<double>((TPZVec<double> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                  in_stack_fffffffffffffd80);
  graduxy<double,double>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  if (*(int *)(in_RDI + 0x10) == 0) {
    dVar5 = (local_d8 / (local_e0 + 1.0)) / (1.0 - (local_e0 + local_e0));
    dVar6 = dVar5;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar1 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    *pdVar2 = dVar5 * ((1.0 - local_e0) * dVar1 + local_e0 * dVar4);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar1 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    *pdVar2 = dVar6 * ((1.0 - local_e0) * dVar1 + local_e0 * dVar4);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar1 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    *pdVar2 = (local_d8 / (local_e0 + 1.0 + local_e0 + 1.0)) * (dVar1 + dVar4);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar1 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    *pdVar2 = dVar1;
  }
  else {
    dVar5 = local_d8 / (1.0 - local_e0 * local_e0);
    dVar6 = dVar5;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar1 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    *pdVar2 = dVar5 * (local_e0 * dVar4 + dVar1);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar1 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    *pdVar2 = dVar6 * (local_e0 * dVar4 + dVar1);
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (int64_t)in_stack_fffffffffffffd90);
    this_00 = (TPZFMatrix<double> *)*pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (this_00,in_stack_fffffffffffffd98,(int64_t)in_stack_fffffffffffffd90);
    dVar4 = (local_d8 / (local_e0 + 1.0 + local_e0 + 1.0)) * ((double)this_00 + *pdVar2);
    pdVar2 = TPZFMatrix<double>::operator()(this_00,in_stack_fffffffffffffd98,(int64_t)dVar4);
    *pdVar2 = dVar4;
    pdVar3 = TPZFMatrix<double>::operator()(this_00,(int64_t)pdVar2,(int64_t)dVar4);
    dVar1 = *pdVar3;
    pdVar2 = TPZFMatrix<double>::operator()(this_00,(int64_t)pdVar2,(int64_t)dVar4);
    *pdVar2 = dVar1;
  }
  TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x1e4edc1);
  return;
}

Assistant:

void TElasticity2DAnalytic::Sigma(const TPZVec<REAL> &x, TPZFMatrix<STATE> &sigma) const
{
    TPZFNMatrix<4,STATE> grad;
    REAL E, nu;
    sigma.Resize(2,2);
    Elastic(x, E, nu);
    graduxy(x,grad);
    //uxy(x,u);
    if (fPlaneStress == 0)
    {
        STATE Fac = E/((STATE)1.+nu)/((STATE(1.)-STATE(2.)*nu));
        sigma(0,0) = Fac*((STATE(1.)-nu)*grad(0,0)+nu*grad(1,1));
        sigma(1,1) = Fac*((STATE(1.)-nu)*grad(1,1)+nu*grad(0,0));
        sigma(0,1) = E/(STATE(2.)*(STATE(1.)+nu))*(grad(0,1)+grad(1,0));
        sigma(1,0) = sigma(0,1);
    }
    else
    {
        STATE Fac = E/((STATE)1.-nu*nu);
        sigma(0,0) = Fac*(grad(0,0)+nu*grad(1,1));
        sigma(1,1) = Fac*(grad(1,1)+nu*grad(0,0));
        sigma(0,1) = E/(STATE(2.)*(STATE(1.)+nu))*(grad(0,1)+grad(1,0));
        sigma(1,0) = sigma(0,1);
    }
}